

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O0

bool __thiscall
slang::analysis::AnalysisScopeVisitor::shouldWarn(AnalysisScopeVisitor *this,Symbol *symbol)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  Scope *this_00;
  Symbol *pSVar2;
  Symbol *in_RSI;
  Scope *in_RDI;
  Symbol *in_stack_00000020;
  Compilation *in_stack_00000028;
  Scope *scope;
  size_t in_stack_ffffffffffffffb8;
  uint7 in_stack_ffffffffffffffc0;
  byte bVar3;
  size_t sVar4;
  char *pcVar5;
  
  this_00 = ast::Symbol::getParentScope(in_RSI);
  bVar1 = ast::Scope::isUninstantiated(in_RDI);
  bVar3 = 0;
  if (!bVar1) {
    pSVar2 = ast::Scope::asSymbol(this_00);
    bVar3 = 0;
    if (pSVar2->kind != Package) {
      sVar4 = (in_RSI->name)._M_len;
      pcVar5 = (in_RSI->name)._M_str;
      ::sv((char *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      __x._M_str = (char *)in_RSI;
      __x._M_len = (size_t)this_00;
      __y._M_str = pcVar5;
      __y._M_len = sVar4;
      bVar1 = std::operator==(__x,__y);
      bVar3 = 0;
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        ast::Scope::getCompilation(this_00);
        bVar1 = hasUnusedAttrib(in_stack_00000028,in_stack_00000020);
        bVar3 = bVar1 ^ 0xff;
      }
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool shouldWarn(const Symbol& symbol) {
        auto scope = symbol.getParentScope();
        return !scope->isUninstantiated() && scope->asSymbol().kind != SymbolKind::Package &&
               symbol.name != "_"sv && !hasUnusedAttrib(scope->getCompilation(), symbol);
    }